

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_6379f8::HandleDirectoryMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pcVar1;
  cmMakefile *this;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  string *psVar6;
  const_iterator cVar7;
  cmGlobalGenerator *this_00;
  bool bVar8;
  ulong uVar9;
  pointer *__ptr;
  pointer pbVar10;
  _Alloc_hider _Var11;
  ulong uVar12;
  int iVar13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  string dir;
  bool exclude_from_all;
  bool optional;
  cmExecutionStatus *local_1f0;
  string destinationStr;
  string permissions_dir;
  string permissions_file;
  string regex;
  bool local_138;
  _Head_base<0UL,_cmInstallGenerator_*,_false> local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string literal_args;
  pointer local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  MessageLevel message;
  undefined4 uStack_d4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  string component;
  string type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurations;
  Helper helper;
  
  local_1f0 = status;
  Helper::Helper(&helper,status);
  optional = false;
  exclude_from_all = false;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  permissions_file._M_dataplus._M_p = (pointer)&permissions_file.field_2;
  permissions_file._M_string_length = 0;
  permissions_file.field_2._M_local_buf[0] = '\0';
  permissions_dir._M_dataplus._M_p = (pointer)&permissions_dir.field_2;
  permissions_dir._M_string_length = 0;
  permissions_dir.field_2._M_local_buf[0] = '\0';
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configurations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  component._M_dataplus._M_p = (pointer)&component.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&component,helper.DefaultComponentName._M_dataplus._M_p,
             helper.DefaultComponentName._M_dataplus._M_p +
             helper.DefaultComponentName._M_string_length);
  literal_args._M_dataplus._M_p = (pointer)&literal_args.field_2;
  literal_args._M_string_length = 0;
  literal_args.field_2._M_local_buf[0] = '\0';
  type._M_dataplus._M_p = (pointer)&type.field_2;
  type._M_string_length = 0;
  type.field_2._M_local_buf[0] = '\0';
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10) < 0x21) {
    if (dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0020a047;
    local_138 = false;
LAB_00209dcc:
    local_e0 = &destinationStr.field_2;
    destinationStr.field_2._M_local_buf[0] = '\0';
    destinationStr._M_string_length = 0;
    destinationStr._M_dataplus._M_p = (pointer)local_e0;
    if (type._M_string_length == 0) {
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
      regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
      regex.field_2._M_allocated_capacity = 0x16;
      regex.field_2._8_8_ = anon_var_dwarf_681cbf;
      views_00._M_len = 2;
      views_00._M_array = (iterator)&regex;
      cmCatViews_abi_cxx11_(&dir,views_00);
      std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
      goto LAB_0020a02e;
    }
    Helper::GetDestinationForType(&regex,&helper,(cmInstallCommandArguments *)0x0,&type);
    local_e8 = &destinationStr;
    std::__cxx11::string::operator=((string *)local_e8,(string *)&regex);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)regex._M_dataplus._M_p != &regex.field_2) {
      operator_delete(regex._M_dataplus._M_p,regex.field_2._M_allocated_capacity + 1);
    }
LAB_0020a04e:
    message = cmInstallGenerator::SelectMessageLevel(helper.Makefile,local_138);
    this = helper.Makefile;
    cmMakefile::GetBacktrace(helper.Makefile);
    std::
    make_unique<cmInstallDirectoryGenerator,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string&,std::__cxx11::string&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&,cmInstallGenerator::MessageLevel&,bool&,std::__cxx11::string&,bool&,cmListFileBacktrace>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&dir,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dirs,
               local_e8,&permissions_file,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&permissions_dir,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&configurations,
               (MessageLevel *)&component,(bool *)&message,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &exclude_from_all,(bool *)&literal_args,(cmListFileBacktrace *)&optional);
    local_130._M_head_impl = (cmInstallGenerator *)dir._M_dataplus;
    dir._M_dataplus._M_p = (pointer)0x0;
    cmMakefile::AddInstallGenerator
              (this,(unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> *)
                    &local_130);
    if (local_130._M_head_impl != (cmInstallGenerator *)0x0) {
      (*((local_130._M_head_impl)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
    }
    local_130._M_head_impl = (cmInstallGenerator *)0x0;
    if (dir._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)dir._M_dataplus._M_p + 8))();
    }
    dir._M_dataplus._M_p = (pointer)0x0;
    if (regex._M_string_length != 0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)regex._M_string_length);
    }
    this_00 = cmMakefile::GetGlobalGenerator(helper.Makefile);
    cmGlobalGenerator::AddInstallComponent(this_00,&component);
    bVar8 = true;
  }
  else {
    iVar13 = 1;
    local_e8 = (pointer)0x0;
    local_138 = false;
    bVar8 = false;
    uVar2 = 2;
    uVar12 = 1;
    do {
      uVar9 = uVar2;
      iVar4 = std::__cxx11::string::compare((char *)(pbVar10 + uVar12));
      if (iVar4 == 0) {
        iVar13 = 2;
        if (!bVar8) goto LAB_00209a63;
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
        regex.field_2._M_allocated_capacity = 0x11;
        regex.field_2._8_8_ = anon_var_dwarf_681dfb;
        views_01._M_len = 4;
        views_01._M_array = (iterator)&regex;
        cmCatViews_abi_cxx11_(&destinationStr,views_01);
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
LAB_0020a320:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)destinationStr._M_dataplus._M_p != &destinationStr.field_2) {
          dir.field_2._M_allocated_capacity =
               CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                        destinationStr.field_2._M_local_buf[0]);
          _Var11._M_p = destinationStr._M_dataplus._M_p;
LAB_0020a32a:
          operator_delete(_Var11._M_p,dir.field_2._M_allocated_capacity + 1);
        }
LAB_0020a332:
        bVar8 = false;
        goto LAB_0020a334;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar4 == 0) {
        iVar13 = 10;
        if (bVar8) {
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
          regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
          regex.field_2._M_allocated_capacity = 0x11;
          regex.field_2._8_8_ = anon_var_dwarf_681dfb;
          views_03._M_len = 4;
          views_03._M_array = (iterator)&regex;
          cmCatViews_abi_cxx11_(&destinationStr,views_03);
          std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
          goto LAB_0020a320;
        }
        goto LAB_00209a63;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar4 == 0) {
        if (bVar8) {
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
          regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
          regex.field_2._M_allocated_capacity = 0x11;
          regex.field_2._8_8_ = anon_var_dwarf_681dfb;
          views_04._M_len = 4;
          views_04._M_array = (iterator)&regex;
          cmCatViews_abi_cxx11_(&destinationStr,views_04);
          std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
          goto LAB_0020a320;
        }
        optional = true;
        goto LAB_00209a60;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar4 == 0) {
        if (bVar8) {
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
          regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
          regex.field_2._M_allocated_capacity = 0x11;
          regex.field_2._8_8_ = anon_var_dwarf_681dfb;
          views_05._M_len = 4;
          views_05._M_array = (iterator)&regex;
          cmCatViews_abi_cxx11_(&destinationStr,views_05);
          std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
          goto LAB_0020a320;
        }
        local_138 = true;
        goto LAB_00209a60;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar4 == 0) {
        iVar13 = 3;
LAB_00209a2f:
        bVar8 = true;
        goto LAB_00209a63;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar4 == 0) {
        iVar13 = 4;
        goto LAB_00209a2f;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar4 == 0) {
        if ((iVar13 - 5U < 0xfffffffe) && (bVar8)) goto LAB_00209a53;
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
        destinationStr._M_dataplus._M_p = &DAT_00000011;
        destinationStr._M_string_length = (size_type)anon_var_dwarf_681dfb;
        cmStrCat<std::__cxx11::string,char[38]>
                  (&dir,(cmAlphaNum *)&regex,(cmAlphaNum *)&destinationStr,pbVar10 + uVar12,
                   (char (*) [38])"\" before a PATTERN or REGEX is given.");
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
LAB_0020a7c6:
        _Var11._M_p = dir._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dir._M_dataplus._M_p != &dir.field_2) goto LAB_0020a32a;
        goto LAB_0020a332;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar4 == 0) {
        if (bVar8) {
          iVar13 = 7;
          std::__cxx11::string::append((char *)&literal_args);
          goto LAB_00209a63;
        }
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
        destinationStr._M_dataplus._M_p = &DAT_00000011;
        destinationStr._M_string_length = (size_type)anon_var_dwarf_681dfb;
        cmStrCat<std::__cxx11::string,char[38]>
                  (&dir,(cmAlphaNum *)&regex,(cmAlphaNum *)&destinationStr,pbVar10 + uVar12,
                   (char (*) [38])"\" before a PATTERN or REGEX is given.");
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
        goto LAB_0020a7c6;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar4 == 0) {
        iVar13 = 5;
        if (!bVar8) goto LAB_00209a63;
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
        destinationStr._M_dataplus._M_p = &DAT_00000011;
        destinationStr._M_string_length = (size_type)anon_var_dwarf_681dfb;
        cmStrCat<std::__cxx11::string,char[26]>
                  (&dir,(cmAlphaNum *)&regex,(cmAlphaNum *)&destinationStr,pbVar10 + uVar12,
                   (char (*) [26])"\" after PATTERN or REGEX.");
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
        goto LAB_0020a7c6;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar4 == 0) {
        iVar13 = 6;
        if (!bVar8) goto LAB_00209a63;
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
        destinationStr._M_dataplus._M_p = &DAT_00000011;
        destinationStr._M_string_length = (size_type)anon_var_dwarf_681dfb;
        cmStrCat<std::__cxx11::string,char[26]>
                  (&dir,(cmAlphaNum *)&regex,(cmAlphaNum *)&destinationStr,pbVar10 + uVar12,
                   (char (*) [26])"\" after PATTERN or REGEX.");
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
        goto LAB_0020a7c6;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar4 == 0) {
        if (!bVar8) {
LAB_00209a53:
          std::__cxx11::string::append((char *)&literal_args);
          goto LAB_00209a60;
        }
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
        destinationStr._M_dataplus._M_p = &DAT_00000011;
        destinationStr._M_string_length = (size_type)anon_var_dwarf_681dfb;
        cmStrCat<std::__cxx11::string,char[26]>
                  (&dir,(cmAlphaNum *)&regex,(cmAlphaNum *)&destinationStr,pbVar10 + uVar12,
                   (char (*) [26])"\" after PATTERN or REGEX.");
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
        goto LAB_0020a7c6;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar4 == 0) {
        if (!bVar8) goto LAB_00209a53;
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
        destinationStr._M_dataplus._M_p = &DAT_00000011;
        destinationStr._M_string_length = (size_type)anon_var_dwarf_681dfb;
        cmStrCat<std::__cxx11::string,char[26]>
                  (&dir,(cmAlphaNum *)&regex,(cmAlphaNum *)&destinationStr,pbVar10 + uVar12,
                   (char (*) [26])"\" after PATTERN or REGEX.");
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
        goto LAB_0020a7c6;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar4 == 0) {
        iVar13 = 8;
        if (!bVar8) goto LAB_00209a63;
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
        destinationStr._M_dataplus._M_p = &DAT_00000011;
        destinationStr._M_string_length = (size_type)anon_var_dwarf_681dfb;
        cmStrCat<std::__cxx11::string,char[26]>
                  (&dir,(cmAlphaNum *)&regex,(cmAlphaNum *)&destinationStr,pbVar10 + uVar12,
                   (char (*) [26])"\" after PATTERN or REGEX.");
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
        goto LAB_0020a7c6;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar4 == 0) {
        iVar13 = 9;
        if (!bVar8) goto LAB_00209a63;
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
        destinationStr._M_dataplus._M_p = &DAT_00000011;
        destinationStr._M_string_length = (size_type)anon_var_dwarf_681dfb;
        cmStrCat<std::__cxx11::string,char[26]>
                  (&dir,(cmAlphaNum *)&regex,(cmAlphaNum *)&destinationStr,pbVar10 + uVar12,
                   (char (*) [26])"\" after PATTERN or REGEX.");
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
        goto LAB_0020a7c6;
      }
      iVar4 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar12));
      if (iVar4 == 0) {
        if (!bVar8) {
          exclude_from_all = true;
          goto LAB_00209a60;
        }
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
        destinationStr._M_dataplus._M_p = &DAT_00000011;
        destinationStr._M_string_length = (size_type)anon_var_dwarf_681dfb;
        cmStrCat<std::__cxx11::string,char[26]>
                  (&dir,(cmAlphaNum *)&regex,(cmAlphaNum *)&destinationStr,pbVar10 + uVar12,
                   (char (*) [26])"\" after PATTERN or REGEX.");
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
        goto LAB_0020a7c6;
      }
      if (9 < iVar13 - 1U) {
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
        regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
        destinationStr._M_dataplus._M_p = (pointer)0x19;
        destinationStr._M_string_length = (long)"STRINGS given unknown argument \"" + 7;
        cmStrCat<std::__cxx11::string,char[3]>
                  (&dir,(cmAlphaNum *)&regex,(cmAlphaNum *)&destinationStr,pbVar10 + uVar12,
                   (char (*) [3])0x6aed64);
        std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
LAB_0020a9d3:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dir._M_dataplus._M_p != &dir.field_2) {
          operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
        }
        bVar8 = false;
        goto LAB_0020a334;
      }
      psVar6 = &component;
      switch(iVar13) {
      case 1:
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        dir._M_dataplus._M_p = (pointer)&dir.field_2;
        pcVar1 = pbVar10[uVar12]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&dir,pcVar1,pcVar1 + pbVar10[uVar12]._M_string_length);
        sVar5 = cmGeneratorExpression::Find(&dir);
        if ((sVar5 != 0) && (bVar3 = cmsys::SystemTools::FileIsFullPath(&dir), !bVar3)) {
          psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(helper.Makefile);
          regex._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
          regex._M_dataplus._M_p = (pointer)psVar6->_M_string_length;
          destinationStr._M_dataplus._M_p = (pointer)0x1;
          destinationStr._M_string_length = (size_type)&destinationStr.field_2;
          destinationStr.field_2._M_local_buf[0] = '/';
          regex.field_2._M_allocated_capacity = 1;
          views._M_len = 3;
          views._M_array = (iterator)&regex;
          regex.field_2._8_8_ = destinationStr._M_string_length;
          cmCatViews_abi_cxx11_((string *)&message,views);
          std::__cxx11::string::operator=((string *)&dir,(string *)&message);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_d4,message) != &local_c8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_d4,message),local_c8._M_allocated_capacity + 1);
          }
        }
        bVar3 = cmsys::SystemTools::FileExists(&dir);
        if ((bVar3) && (bVar3 = cmsys::SystemTools::FileIsDirectory(&dir), !bVar3)) {
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
          regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
          destinationStr._M_dataplus._M_p = (pointer)0x16;
          destinationStr._M_string_length = (size_type)anon_var_dwarf_681efe;
          cmStrCat<std::__cxx11::string,char[14]>
                    ((string *)&message,(cmAlphaNum *)&regex,(cmAlphaNum *)&destinationStr,
                     pbVar10 + uVar12,(char (*) [14])"\" to install.");
          std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(uStack_d4,message) != &local_c8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(uStack_d4,message),local_c8._M_allocated_capacity + 1);
          }
          goto LAB_0020a9d3;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&dirs,&dir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)dir._M_dataplus._M_p != &dir.field_2) {
          operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
        }
        iVar13 = 1;
        break;
      case 2:
        local_e8 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar12;
        iVar13 = 0;
        break;
      case 3:
        std::__cxx11::string::append((char *)&literal_args);
        cmsys::Glob::PatternToRegex
                  (&regex,(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar12,false,false);
        cmsys::SystemTools::ReplaceString(&regex,"\\","\\\\");
        std::__cxx11::string::_M_append((char *)&literal_args,(ulong)regex._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&literal_args);
        goto LAB_00209c9a;
      case 4:
        std::__cxx11::string::append((char *)&literal_args);
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        regex._M_dataplus._M_p = (pointer)&regex.field_2;
        pcVar1 = pbVar10[uVar12]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&regex,pcVar1,pcVar1 + pbVar10[uVar12]._M_string_length);
        cmsys::SystemTools::ReplaceString(&regex,"\\","\\\\");
        std::__cxx11::string::_M_append((char *)&literal_args,(ulong)regex._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&literal_args);
LAB_00209c9a:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)regex._M_dataplus._M_p != &regex.field_2) {
          operator_delete(regex._M_dataplus._M_p,regex.field_2._M_allocated_capacity + 1);
        }
LAB_00209a60:
        iVar13 = 0;
        break;
      case 5:
        bVar3 = cmInstallCommandArguments::CheckPermissions
                          ((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar12,&permissions_file);
        iVar13 = 5;
        if (!bVar3) {
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
          regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
          destinationStr._M_dataplus._M_p = (pointer)0x20;
          destinationStr._M_string_length = (size_type)anon_var_dwarf_681f59;
          cmStrCat<std::__cxx11::string,char[3]>
                    (&dir,(cmAlphaNum *)&regex,(cmAlphaNum *)&destinationStr,pbVar10 + uVar12,
                     (char (*) [3])0x6aed64);
          std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
          goto LAB_0020a9d3;
        }
        break;
      case 6:
        bVar3 = cmInstallCommandArguments::CheckPermissions
                          ((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar12,&permissions_dir);
        iVar13 = 6;
        if (!bVar3) {
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
          regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
          destinationStr._M_dataplus._M_p = (pointer)0x25;
          destinationStr._M_string_length = (size_type)anon_var_dwarf_681f66;
          cmStrCat<std::__cxx11::string,char[3]>
                    (&dir,(cmAlphaNum *)&regex,(cmAlphaNum *)&destinationStr,pbVar10 + uVar12,
                     (char (*) [3])0x6aed64);
          std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
          goto LAB_0020a9d3;
        }
        break;
      case 7:
        bVar3 = cmInstallCommandArguments::CheckPermissions
                          ((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar12,&literal_args);
        iVar13 = 7;
        if (!bVar3) {
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
          regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
          destinationStr._M_dataplus._M_p = (pointer)0x1b;
          destinationStr._M_string_length = (size_type)anon_var_dwarf_681f73;
          cmStrCat<std::__cxx11::string,char[3]>
                    (&dir,(cmAlphaNum *)&regex,(cmAlphaNum *)&destinationStr,pbVar10 + uVar12,
                     (char (*) [3])0x6aed64);
          std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
          goto LAB_0020a9d3;
        }
        break;
      case 8:
        iVar13 = 8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&configurations,
                    (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar12);
        break;
      case 9:
        goto switchD_00209888_caseD_9;
      case 10:
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(anonymous_namespace)::allowedTypes_abi_cxx11_,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar12);
        psVar6 = &type;
        if (cVar7._M_node == (_Base_ptr)((anonymous_namespace)::allowedTypes_abi_cxx11_ + 8)) {
          pbVar10 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
          regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
          destinationStr._M_dataplus._M_p = &DAT_00000011;
          destinationStr._M_string_length = (size_type)anon_var_dwarf_681c0f;
          cmStrCat<std::__cxx11::string,char[22]>
                    (&dir,(cmAlphaNum *)&regex,(cmAlphaNum *)&destinationStr,pbVar10 + uVar12,
                     (char (*) [22])"\" with TYPE argument.");
          std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
          goto LAB_0020a9d3;
        }
        goto switchD_00209888_caseD_9;
      }
LAB_00209a63:
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar2 = (ulong)((int)uVar9 + 1);
      uVar12 = uVar9;
    } while (uVar9 < (ulong)((long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10 >> 5)
            );
    if ((dirs.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         dirs.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) && (local_e8 != (pointer)0x0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&dirs);
    }
    if (dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        dirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0020a047:
      bVar8 = true;
      goto LAB_0020a334;
    }
    destinationStr._M_dataplus._M_p = (pointer)&destinationStr.field_2;
    destinationStr._M_string_length = 0;
    destinationStr.field_2._M_local_buf[0] = '\0';
    if (local_e8 == (pointer)0x0) goto LAB_00209dcc;
    if (type._M_string_length == 0) goto LAB_0020a04e;
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    regex._M_string_length = (size_type)(pbVar10->_M_dataplus)._M_p;
    regex._M_dataplus._M_p = (pointer)pbVar10->_M_string_length;
    regex.field_2._M_allocated_capacity = 0x45;
    regex.field_2._8_8_ = anon_var_dwarf_681ca6;
    views_02._M_len = 2;
    views_02._M_array = (iterator)&regex;
    cmCatViews_abi_cxx11_(&dir,views_02);
    std::__cxx11::string::_M_assign((string *)&local_1f0->Error);
LAB_0020a02e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dir._M_dataplus._M_p != &dir.field_2) {
      operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
    }
    bVar8 = false;
  }
  local_e0 = &destinationStr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)destinationStr._M_dataplus._M_p != local_e0) {
    operator_delete(destinationStr._M_dataplus._M_p,
                    CONCAT71(destinationStr.field_2._M_allocated_capacity._1_7_,
                             destinationStr.field_2._M_local_buf[0]) + 1);
  }
LAB_0020a334:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)type._M_dataplus._M_p != &type.field_2) {
    operator_delete(type._M_dataplus._M_p,
                    CONCAT71(type.field_2._M_allocated_capacity._1_7_,type.field_2._M_local_buf[0])
                    + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)literal_args._M_dataplus._M_p != &literal_args.field_2) {
    operator_delete(literal_args._M_dataplus._M_p,
                    CONCAT71(literal_args.field_2._M_allocated_capacity._1_7_,
                             literal_args.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)component._M_dataplus._M_p != &component.field_2) {
    operator_delete(component._M_dataplus._M_p,component.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configurations);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)permissions_dir._M_dataplus._M_p != &permissions_dir.field_2) {
    operator_delete(permissions_dir._M_dataplus._M_p,
                    CONCAT71(permissions_dir.field_2._M_allocated_capacity._1_7_,
                             permissions_dir.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)permissions_file._M_dataplus._M_p != &permissions_file.field_2) {
    operator_delete(permissions_file._M_dataplus._M_p,
                    CONCAT71(permissions_file.field_2._M_allocated_capacity._1_7_,
                             permissions_file.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&dirs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)helper.DefaultComponentName._M_dataplus._M_p != &helper.DefaultComponentName.field_2) {
    operator_delete(helper.DefaultComponentName._M_dataplus._M_p,
                    helper.DefaultComponentName.field_2._M_allocated_capacity + 1);
  }
  return bVar8;
switchD_00209888_caseD_9:
  std::__cxx11::string::_M_assign((string *)psVar6);
  goto LAB_00209a60;
}

Assistant:

bool HandleDirectoryMode(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  Helper helper(status);

  enum Doing
  {
    DoingNone,
    DoingDirs,
    DoingDestination,
    DoingPattern,
    DoingRegex,
    DoingPermsFile,
    DoingPermsDir,
    DoingPermsMatch,
    DoingConfigurations,
    DoingComponent,
    DoingType
  };
  Doing doing = DoingDirs;
  bool in_match_mode = false;
  bool optional = false;
  bool exclude_from_all = false;
  bool message_never = false;
  std::vector<std::string> dirs;
  const std::string* destination = nullptr;
  std::string permissions_file;
  std::string permissions_dir;
  std::vector<std::string> configurations;
  std::string component = helper.DefaultComponentName;
  std::string literal_args;
  std::string type;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "DESTINATION") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Switch to setting the destination property.
      doing = DoingDestination;
    } else if (args[i] == "TYPE") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Switch to setting the type.
      doing = DoingType;
    } else if (args[i] == "OPTIONAL") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Mark the rule as optional.
      optional = true;
      doing = DoingNone;
    } else if (args[i] == "MESSAGE_NEVER") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Mark the rule as quiet.
      message_never = true;
      doing = DoingNone;
    } else if (args[i] == "PATTERN") {
      // Switch to a new pattern match rule.
      doing = DoingPattern;
      in_match_mode = true;
    } else if (args[i] == "REGEX") {
      // Switch to a new regex match rule.
      doing = DoingRegex;
      in_match_mode = true;
    } else if (args[i] == "EXCLUDE") {
      // Add this property to the current match rule.
      if (!in_match_mode || doing == DoingPattern || doing == DoingRegex) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" before a PATTERN or REGEX is given."));
        return false;
      }
      literal_args += " EXCLUDE";
      doing = DoingNone;
    } else if (args[i] == "PERMISSIONS") {
      if (!in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" before a PATTERN or REGEX is given."));
        return false;
      }

      // Switch to setting the current match permissions property.
      literal_args += " PERMISSIONS";
      doing = DoingPermsMatch;
    } else if (args[i] == "FILE_PERMISSIONS") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Switch to setting the file permissions property.
      doing = DoingPermsFile;
    } else if (args[i] == "DIRECTORY_PERMISSIONS") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Switch to setting the directory permissions property.
      doing = DoingPermsDir;
    } else if (args[i] == "USE_SOURCE_PERMISSIONS") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Add this option literally.
      literal_args += " USE_SOURCE_PERMISSIONS";
      doing = DoingNone;
    } else if (args[i] == "FILES_MATCHING") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Add this option literally.
      literal_args += " FILES_MATCHING";
      doing = DoingNone;
    } else if (args[i] == "CONFIGURATIONS") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Switch to setting the configurations property.
      doing = DoingConfigurations;
    } else if (args[i] == "COMPONENT") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }

      // Switch to setting the component property.
      doing = DoingComponent;
    } else if (args[i] == "EXCLUDE_FROM_ALL") {
      if (in_match_mode) {
        status.SetError(cmStrCat(args[0], " does not allow \"", args[i],
                                 "\" after PATTERN or REGEX."));
        return false;
      }
      exclude_from_all = true;
      doing = DoingNone;
    } else if (doing == DoingDirs) {
      // Convert this directory to a full path.
      std::string dir = args[i];
      std::string::size_type gpos = cmGeneratorExpression::Find(dir);
      if (gpos != 0 && !cmSystemTools::FileIsFullPath(dir)) {
        dir =
          cmStrCat(helper.Makefile->GetCurrentSourceDirectory(), '/', args[i]);
      }

      // Make sure the name is a directory.
      if (cmSystemTools::FileExists(dir) &&
          !cmSystemTools::FileIsDirectory(dir)) {
        status.SetError(cmStrCat(args[0], " given non-directory \"", args[i],
                                 "\" to install."));
        return false;
      }

      // Store the directory for installation.
      dirs.push_back(std::move(dir));
    } else if (doing == DoingConfigurations) {
      configurations.push_back(args[i]);
    } else if (doing == DoingDestination) {
      destination = &args[i];
      doing = DoingNone;
    } else if (doing == DoingType) {
      if (allowedTypes.count(args[i]) == 0) {
        status.SetError(cmStrCat(args[0], " given non-type \"", args[i],
                                 "\" with TYPE argument."));
        return false;
      }

      type = args[i];
      doing = DoingNone;
    } else if (doing == DoingPattern) {
      // Convert the pattern to a regular expression.  Require a
      // leading slash and trailing end-of-string in the matched
      // string to make sure the pattern matches only whole file
      // names.
      literal_args += " REGEX \"/";
      std::string regex = cmsys::Glob::PatternToRegex(args[i], false);
      cmSystemTools::ReplaceString(regex, "\\", "\\\\");
      literal_args += regex;
      literal_args += "$\"";
      doing = DoingNone;
    } else if (doing == DoingRegex) {
      literal_args += " REGEX \"";
// Match rules are case-insensitive on some platforms.
#if defined(_WIN32) || defined(__APPLE__)
      std::string regex = cmSystemTools::LowerCase(args[i]);
#else
      std::string regex = args[i];
#endif
      cmSystemTools::ReplaceString(regex, "\\", "\\\\");
      literal_args += regex;
      literal_args += "\"";
      doing = DoingNone;
    } else if (doing == DoingComponent) {
      component = args[i];
      doing = DoingNone;
    } else if (doing == DoingPermsFile) {
      // Check the requested permission.
      if (!cmInstallCommandArguments::CheckPermissions(args[i],
                                                       permissions_file)) {
        status.SetError(cmStrCat(args[0], " given invalid file permission \"",
                                 args[i], "\"."));
        return false;
      }
    } else if (doing == DoingPermsDir) {
      // Check the requested permission.
      if (!cmInstallCommandArguments::CheckPermissions(args[i],
                                                       permissions_dir)) {
        status.SetError(cmStrCat(
          args[0], " given invalid directory permission \"", args[i], "\"."));
        return false;
      }
    } else if (doing == DoingPermsMatch) {
      // Check the requested permission.
      if (!cmInstallCommandArguments::CheckPermissions(args[i],
                                                       literal_args)) {
        status.SetError(
          cmStrCat(args[0], " given invalid permission \"", args[i], "\"."));
        return false;
      }
    } else {
      // Unknown argument.
      status.SetError(
        cmStrCat(args[0], " given unknown argument \"", args[i], "\"."));
      return false;
    }
  }

  // Support installing an empty directory.
  if (dirs.empty() && destination) {
    dirs.emplace_back();
  }

  // Check if there is something to do.
  if (dirs.empty()) {
    return true;
  }
  std::string destinationStr;
  if (!destination) {
    if (type.empty()) {
      // A destination is required.
      status.SetError(cmStrCat(args[0], " given no DESTINATION!"));
      return false;
    }
    destinationStr = helper.GetDestinationForType(nullptr, type);
    destination = &destinationStr;
  } else if (!type.empty()) {
    status.SetError(cmStrCat(args[0],
                             " given both TYPE and DESTINATION "
                             "arguments. You may only specify one."));
    return false;
  }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(helper.Makefile, message_never);

  // Create the directory install generator.
  helper.Makefile->AddInstallGenerator(
    cm::make_unique<cmInstallDirectoryGenerator>(
      dirs, *destination, permissions_file, permissions_dir, configurations,
      component, message, exclude_from_all, literal_args, optional,
      helper.Makefile->GetBacktrace()));

  // Tell the global generator about any installation component names
  // specified.
  helper.Makefile->GetGlobalGenerator()->AddInstallComponent(component);

  return true;
}